

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::javanano::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Params *params,
          FieldDescriptor *field,bool boxed)

{
  Type field_type;
  JavaType JVar1;
  string *psVar2;
  Descriptor *pDVar3;
  LogMessage *other;
  string *extraout_RAX;
  JavaType type;
  LogFinisher local_59;
  LogMessage local_58;
  
  field_type = FieldDescriptor::type((FieldDescriptor *)params);
  JVar1 = GetJavaType(field_type);
  if (JAVATYPE_ENUM < JVar1) {
    if (JVar1 == JAVATYPE_MESSAGE) {
      pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)params);
      psVar2 = ToJavaName(__return_storage_ptr__,(Params *)this,*(string **)pDVar3,true,
                          *(Descriptor **)(pDVar3 + 0x18),*(FileDescriptor **)(pDVar3 + 0x10));
      return psVar2;
    }
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_map_field.cc"
               ,0x44);
    other = internal::LogMessage::operator<<(&local_58,"should not reach here.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX;
  }
  if ((char)field != '\0') {
    psVar2 = BoxedPrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar1,type)
    ;
    return psVar2;
  }
  psVar2 = PrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar1,type);
  return psVar2;
}

Assistant:

string TypeName(const Params& params, const FieldDescriptor* field,
                bool boxed) {
  JavaType java_type = GetJavaType(field);
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      return ClassName(params, field->message_type());
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
    case JAVATYPE_ENUM:
      if (boxed) {
        return BoxedPrimitiveTypeName(java_type);
      } else {
        return PrimitiveTypeName(java_type);
      }
    // No default because we want the compiler to complain if any new JavaTypes
    // are added..
  }

  GOOGLE_LOG(FATAL) << "should not reach here.";
  return "";
}